

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O1

lzma_ret lzma_block_header_size(lzma_block *block)

{
  long *plVar1;
  lzma_vli vli;
  uint32_t uVar2;
  lzma_ret lVar3;
  undefined8 in_RAX;
  lzma_ret lVar4;
  lzma_filter *filter;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  uint32_t add;
  undefined8 uStack_38;
  
  lVar4 = LZMA_OPTIONS_ERROR;
  if (block->version == 0) {
    vli = block->compressed_size;
    uStack_38 = in_RAX;
    if (vli == 0xffffffffffffffff) {
      iVar8 = 6;
    }
    else {
      uVar2 = lzma_vli_size(vli);
      iVar8 = 6;
      if (vli != 0) {
        iVar8 = uVar2 + 6;
      }
      if (vli == 0 || uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      uVar2 = lzma_vli_size(block->uncompressed_size);
      if (uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
      iVar8 = iVar8 + uVar2;
    }
    lVar4 = LZMA_PROG_ERROR;
    if ((block->filters != (lzma_filter *)0x0) && (block->filters->id != 0xffffffffffffffff)) {
      filter = block->filters;
      if (filter->id != 0xffffffffffffffff) {
        lVar5 = 4;
        lVar6 = 0x10;
        lVar7 = 0;
        do {
          bVar9 = lVar5 == 0;
          lVar5 = lVar5 + -1;
          if (bVar9) {
            bVar9 = false;
            lVar4 = LZMA_PROG_ERROR;
          }
          else {
            lVar3 = lzma_filter_flags_size((uint32_t *)((long)&uStack_38 + 4),filter);
            if (lVar3 == LZMA_OK) {
              iVar8 = iVar8 + uStack_38._4_4_;
              bVar9 = true;
            }
            else {
              bVar9 = false;
              lVar4 = lVar3;
            }
          }
          if (!bVar9) {
            return lVar4;
          }
          lVar7 = lVar7 + 1;
          filter = block->filters + lVar7;
          plVar1 = (long *)((long)&block->filters->id + lVar6);
          lVar6 = lVar6 + 0x10;
        } while (*plVar1 != -1);
      }
      block->header_size = iVar8 + 3U & 0xfffffffc;
      lVar4 = LZMA_OK;
    }
  }
  return lVar4;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	size_t i;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	if (block->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		uint32_t add;

		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}